

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void ra_append_copies_after
               (roaring_array_t *ra,roaring_array_t *sa,uint16_t before_start,_Bool copy_on_write)

{
  ushort uVar1;
  int end_index;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  end_index = sa->size;
  if (((long)end_index == 0) || (sa->keys[(long)end_index + -1] == before_start)) {
    uVar2 = end_index - 1;
  }
  else {
    if (end_index < 1) {
      uVar3 = 0;
      goto LAB_0011afc4;
    }
    iVar4 = end_index + -1;
    uVar2 = 0;
    do {
      uVar3 = iVar4 + uVar2 >> 1;
      uVar1 = *(ushort *)((long)sa->keys + (ulong)(iVar4 + uVar2 & 0xfffffffe));
      if (uVar1 < before_start) {
        uVar2 = uVar3 + 1;
      }
      else {
        if (uVar1 <= before_start) {
          uVar3 = uVar3 + 1;
          goto LAB_0011afc4;
        }
        iVar4 = uVar3 - 1;
      }
    } while ((int)uVar2 <= iVar4);
    uVar2 = ~uVar2;
  }
  uVar3 = ~uVar2;
  if (-1 < (int)uVar2) {
    uVar3 = uVar2 + 1;
  }
LAB_0011afc4:
  ra_append_copy_range(ra,sa,uVar3,end_index,copy_on_write);
  return;
}

Assistant:

void ra_append_copies_after(roaring_array_t *ra, const roaring_array_t *sa,
                            uint16_t before_start, bool copy_on_write) {
    int start_location = ra_get_index(sa, before_start);
    if (start_location >= 0)
        ++start_location;
    else
        start_location = -start_location - 1;
    ra_append_copy_range(ra, sa, start_location, sa->size, copy_on_write);
}